

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImU32 IVar4;
  GetterYs<unsigned_int> *pGVar5;
  TransformerLogLin *pTVar6;
  ImPlotPlot *pIVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  int iVar15;
  ImDrawIdx IVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pIVar13 = GImPlot;
  pGVar5 = this->Getter1;
  pTVar6 = this->Transformer;
  iVar15 = pGVar5->Count;
  uVar3 = *(uint *)((long)pGVar5->Ys +
                   (long)(((prim + pGVar5->Offset) % iVar15 + iVar15) % iVar15) *
                   (long)pGVar5->Stride);
  dVar18 = log10((pGVar5->XScale * (double)prim + pGVar5->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar7 = pIVar13->CurrentPlot;
  dVar1 = (pIVar7->XAxis).Range.Min;
  iVar15 = pTVar6->YAxis;
  pGVar8 = this->Getter2;
  pTVar6 = this->Transformer;
  IVar2 = pIVar13->PixelRange[iVar15].Min;
  fVar21 = (float)(pIVar13->My[iVar15] * ((double)uVar3 - pIVar7->YAxis[iVar15].Range.Min) +
                  (double)IVar2.y);
  fVar22 = (float)(pIVar13->Mx *
                   (((double)(float)(dVar18 / pIVar13->LogDenX) *
                     ((pIVar7->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar1 = pGVar8->YRef;
  dVar19 = log10(((double)prim * pGVar8->XScale + pGVar8->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar14->CurrentPlot;
  dVar18 = (pIVar7->XAxis).Range.Min;
  iVar15 = pTVar6->YAxis;
  IVar2 = pIVar14->PixelRange[iVar15].Min;
  fVar17 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar19 / pIVar14->LogDenX) *
                     ((pIVar7->XAxis).Range.Max - dVar18) + dVar18) - dVar18) + (double)IVar2.x);
  fVar20 = (float)(pIVar14->My[iVar15] * (dVar1 - pIVar7->YAxis[iVar15].Range.Min) + (double)IVar2.y
                  );
  auVar26._0_4_ = ~-(uint)(fVar17 <= fVar22) & (uint)fVar17;
  auVar26._4_4_ = ~-(uint)(fVar20 <= fVar21) & (uint)fVar20;
  auVar26._8_4_ = ~-(uint)(fVar22 < fVar17) & (uint)fVar17;
  auVar26._12_4_ = ~-(uint)(fVar21 < fVar20) & (uint)fVar20;
  auVar11._4_4_ = (uint)fVar21 & -(uint)(fVar20 <= fVar21);
  auVar11._0_4_ = (uint)fVar22 & -(uint)(fVar17 <= fVar22);
  auVar11._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar17);
  auVar11._12_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar20);
  auVar26 = auVar26 | auVar11;
  fVar23 = (cull_rect->Min).y;
  auVar28._4_4_ = -(uint)(fVar23 < auVar26._4_4_);
  auVar28._0_4_ = -(uint)((cull_rect->Min).x < auVar26._0_4_);
  auVar12._4_8_ = auVar26._8_8_;
  auVar12._0_4_ = -(uint)(auVar26._4_4_ < fVar23);
  auVar27._0_8_ = auVar12._0_8_ << 0x20;
  auVar27._8_4_ = -(uint)(auVar26._8_4_ < (cull_rect->Max).x);
  auVar27._12_4_ = -(uint)(auVar26._12_4_ < (cull_rect->Max).y);
  auVar28._8_8_ = auVar27._8_8_;
  iVar15 = movmskps((int)pIVar7,auVar28);
  if (iVar15 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar23 = fVar17 - fVar22;
    fVar24 = fVar20 - fVar21;
    fVar25 = fVar23 * fVar23 + fVar24 * fVar24;
    if (0.0 < fVar25) {
      fVar25 = 1.0 / SQRT(fVar25);
      fVar23 = fVar23 * fVar25;
      fVar24 = fVar24 * fVar25;
    }
    fVar25 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    fVar23 = fVar25 * fVar23;
    fVar25 = fVar25 * fVar24;
    (pIVar9->pos).x = fVar25 + fVar22;
    (pIVar9->pos).y = fVar21 - fVar23;
    (pIVar9->uv).x = IVar2.x;
    (pIVar9->uv).y = IVar2.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar4;
    pIVar9[1].pos.x = fVar25 + fVar17;
    pIVar9[1].pos.y = fVar20 - fVar23;
    pIVar9[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar17 - fVar25;
    pIVar9[2].pos.y = fVar20 + fVar23;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    pIVar9[3].pos.x = fVar22 - fVar25;
    pIVar9[3].pos.y = fVar23 + fVar21;
    pIVar9[3].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar3;
    *pIVar10 = IVar16;
    pIVar10[1] = IVar16 + 1;
    pIVar10[2] = IVar16 + 2;
    pIVar10[3] = IVar16;
    pIVar10[4] = IVar16 + 2;
    pIVar10[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar3 + 4;
  }
  return (char)iVar15 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }